

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
write(arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  void *__buf_00;
  ssize_t extraout_RAX;
  ssize_t sVar1;
  InternalException *this_00;
  undefined4 in_register_00000034;
  basic_string_view<wchar_t> s;
  allocator local_39;
  string local_38;
  
  s.data_ = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  if (s.data_ == (wchar_t *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"string pointer is null",&local_39);
    duckdb::InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&duckdb::InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  __buf_00 = (void *)wcslen(s.data_);
  if (this->specs_ != (format_specs *)0x0) {
    s.size_ = (size_t)__buf_00;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write<wchar_t>
              (&this->writer_,s,this->specs_);
    return extraout_RAX;
  }
  sVar1 = basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write
                    (&this->writer_,__fd,__buf_00,0);
  return sVar1;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(duckdb::InternalException("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }